

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string_view __thiscall
google::protobuf::Reflection::GetStringViewImpl
          (Reflection *this,Message *message,FieldDescriptor *field,ScratchSpace *scratch)

{
  ReflectionSchema *this_00;
  void *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  CppStringType CVar4;
  Cord **ppCVar5;
  ArenaStringPtr *pAVar6;
  string *psVar7;
  Cord *cord;
  OneofDescriptor *oneof_descriptor;
  string_view sVar8;
  
  this_00 = &this->schema_;
  if ((field->field_0x1 & 8) != 0) {
    uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
    psVar7 = internal::ExtensionSet::GetString
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                        field->number_,(field->field_20).default_value_string_);
    goto LAB_001f55af;
  }
  bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar2) {
    if ((field->field_0x1 & 0x10) == 0) {
      oneof_descriptor = (OneofDescriptor *)0x0;
    }
    else {
      oneof_descriptor = (field->scope_).containing_oneof;
      if (oneof_descriptor == (OneofDescriptor *)0x0) goto LAB_001f55ee;
    }
    uVar3 = GetOneofCase(this,message,oneof_descriptor);
    if (uVar3 == field->number_) goto LAB_001f5561;
  }
  else {
LAB_001f5561:
    CVar4 = FieldDescriptor::cpp_string_type(field);
    if (CVar4 == kCord) {
      bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
      if (bVar2) {
        ppCVar5 = GetRaw<absl::lts_20250127::Cord*>(this,message,field);
        cord = *ppCVar5;
      }
      else {
        cord = GetRaw<absl::lts_20250127::Cord>(this,message,field);
      }
      if (scratch != (ScratchSpace *)0x0) {
        sVar8 = ScratchSpace::CopyFromCord(scratch,cord);
        return sVar8;
      }
      GetStringViewImpl();
LAB_001f55ee:
      internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb31);
    }
    pAVar6 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
    pvVar1 = (pAVar6->tagged_ptr_).ptr_;
    if (((ulong)pvVar1 & 3) != 0) {
      psVar7 = (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
      goto LAB_001f55af;
    }
  }
  psVar7 = (field->field_20).default_value_string_;
LAB_001f55af:
  sVar8._M_str = (psVar7->_M_dataplus)._M_p;
  sVar8._M_len = psVar7->_M_string_length;
  return sVar8;
}

Assistant:

absl::string_view Reflection::GetStringViewImpl(const Message& message,
                                                const FieldDescriptor* field,
                                                ScratchSpace* scratch) const {
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  }
  if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
    return field->default_value_string();
  }

  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      const auto& cord = schema_.InRealOneof(field)
                             ? *GetField<absl::Cord*>(message, field)
                             : GetField<absl::Cord>(message, field);
      ABSL_DCHECK(scratch);
      return scratch->CopyFromCord(cord);
    }
    default:
      auto str = GetField<ArenaStringPtr>(message, field);
      return str.IsDefault() ? field->default_value_string() : str.Get();
  }
}